

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cClipControlTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::ClipControlRenderBaseTest::fuzzyDepthCompare
          (ClipControlRenderBaseTest *this,TestLog *log,char *imageSetName,char *imageSetDesc,
          TextureLevel *reference,TextureLevel *result,float threshold,TextureLevel *importanceMask)

{
  ostringstream *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  ConstPixelBufferAccess *pCVar3;
  LogImage *access;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  bool bVar4;
  int iVar5;
  int y;
  int iVar6;
  float fVar7;
  float fVar8;
  string local_3b8;
  Vec4 local_398;
  Vec4 local_388;
  undefined1 local_370 [40];
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  LogImageSet local_2a8;
  LogImage local_268;
  ConstPixelBufferAccess local_1d8;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [4];
  ios_base local_138 [264];
  
  iVar6 = (result->m_size).m_data[1];
  if (iVar6 < 1) {
    bVar4 = true;
  }
  else {
    iVar5 = (result->m_size).m_data[0];
    fVar8 = 0.0;
    y = 0;
    bVar2 = true;
    do {
      if ((0 < iVar5) && (bVar2)) {
        iVar6 = 1;
        do {
          iVar5 = iVar6 + -1;
          tcu::TextureLevel::getAccess((ConstPixelBufferAccess *)local_1b0,reference);
          fVar8 = tcu::ConstPixelBufferAccess::getPixDepth
                            ((ConstPixelBufferAccess *)local_1b0,iVar5,y,0);
          tcu::TextureLevel::getAccess((ConstPixelBufferAccess *)local_1b0,result);
          fVar7 = tcu::ConstPixelBufferAccess::getPixDepth
                            ((ConstPixelBufferAccess *)local_1b0,iVar5,y,0);
          fVar8 = ABS(fVar8 - fVar7);
          if (importanceMask != (TextureLevel *)0x0) {
            tcu::TextureLevel::getAccess((ConstPixelBufferAccess *)local_1b0,importanceMask);
            fVar7 = tcu::ConstPixelBufferAccess::getPixDepth
                              ((ConstPixelBufferAccess *)local_1b0,iVar5,y,0);
            fVar8 = fVar8 * fVar7;
          }
          bVar2 = fVar8 < threshold;
          iVar5 = (result->m_size).m_data[0];
        } while ((iVar6 < iVar5) && (iVar6 = iVar6 + 1, fVar8 < threshold));
        iVar6 = (result->m_size).m_data[1];
      }
      y = y + 1;
    } while ((y < iVar6) && (bVar2));
    bVar4 = true;
    if (!bVar2) {
      this_00 = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"Image comparison failed: difference = ",0x26);
      std::ostream::_M_insert<double>((double)fVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", threshold = ",0xe);
      std::ostream::_M_insert<double>((double)threshold);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base(local_138);
      bVar4 = false;
    }
  }
  local_388.m_data[0] = 0.0;
  local_388.m_data[1] = 0.0;
  local_388.m_data[2] = 0.0;
  local_388.m_data[3] = 0.0;
  local_398.m_data[0] = 1.0;
  local_398.m_data[1] = 1.0;
  local_398.m_data[2] = 1.0;
  local_398.m_data[3] = 1.0;
  local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"Result","");
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2c8,"Depth image comparison result","");
  tcu::LogImageSet::LogImageSet(&local_2a8,&local_3b8,&local_2c8);
  tcu::TestLog::startImageSet
            (log,local_2a8.m_name._M_dataplus._M_p,local_2a8.m_description._M_dataplus._M_p);
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"Result","");
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"Result","");
  tcu::TextureLevel::getAccess((ConstPixelBufferAccess *)local_370,result);
  pCVar3 = (ConstPixelBufferAccess *)local_370;
  tcu::LogImage::LogImage
            ((LogImage *)local_1b0,&local_2e8,&local_308,pCVar3,&local_398,&local_388,
             QP_IMAGE_COMPRESSION_MODE_BEST);
  iVar6 = (int)log;
  tcu::LogImage::write((LogImage *)local_1b0,iVar6,__buf,(size_t)pCVar3);
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"Reference","");
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"Reference","");
  tcu::TextureLevel::getAccess(&local_1d8,reference);
  pCVar3 = &local_1d8;
  tcu::LogImage::LogImage
            (&local_268,&local_328,&local_348,pCVar3,&local_398,&local_388,
             QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write(&local_268,iVar6,__buf_00,(size_t)pCVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.m_description._M_dataplus._M_p != &local_268.m_description.field_2) {
    operator_delete(local_268.m_description._M_dataplus._M_p,
                    local_268.m_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.m_name._M_dataplus._M_p != &local_268.m_name.field_2) {
    operator_delete(local_268.m_name._M_dataplus._M_p,
                    local_268.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_p != local_180) {
    operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._0_8_ != &local_1a0) {
    operator_delete((void *)local_1b0._0_8_,local_1a0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8.m_description._M_dataplus._M_p != &local_2a8.m_description.field_2) {
    operator_delete(local_2a8.m_description._M_dataplus._M_p,
                    local_2a8.m_description.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_2a8.m_name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8.m_name._M_dataplus._M_p,
                    local_2a8.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
    operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
  }
  if (importanceMask != (TextureLevel *)0x0) {
    local_2a8.m_name._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"Importance mask","");
    local_370._0_8_ = (long)local_370 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_370,"mask","");
    tcu::TextureLevel::getAccess((ConstPixelBufferAccess *)&local_268,importanceMask);
    access = &local_268;
    tcu::LogImage::LogImage
              ((LogImage *)local_1b0,&local_2a8.m_name,(string *)local_370,
               (ConstPixelBufferAccess *)access,&local_398,&local_388,QP_IMAGE_COMPRESSION_MODE_BEST
              );
    tcu::LogImage::write((LogImage *)local_1b0,iVar6,__buf_01,(size_t)access);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_p != local_180) {
      operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._0_8_ != &local_1a0) {
      operator_delete((void *)local_1b0._0_8_,local_1a0._M_allocated_capacity + 1);
    }
    if (local_370._0_8_ != (long)local_370 + 0x10) {
      operator_delete((void *)local_370._0_8_,local_370._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8.m_name._M_dataplus._M_p != paVar1) {
      operator_delete(local_2a8.m_name._M_dataplus._M_p,
                      local_2a8.m_name.field_2._M_allocated_capacity + 1);
    }
  }
  tcu::TestLog::endImageSet(log);
  return bVar4;
}

Assistant:

bool fuzzyDepthCompare(tcu::TestLog& log, const char* imageSetName, const char* imageSetDesc,
						   const tcu::TextureLevel& reference, const tcu::TextureLevel& result, float threshold,
						   const tcu::TextureLevel* importanceMask = NULL)
	{
		(void)imageSetName;
		(void)imageSetDesc;
		bool  depthOk	= true;
		float difference = 0.0f;

		for (int y = 0; y < result.getHeight() && depthOk; y++)
		{
			for (int x = 0; x < result.getWidth() && depthOk; x++)
			{
				float ref  = reference.getAccess().getPixDepth(x, y);
				float res  = result.getAccess().getPixDepth(x, y);
				difference = std::abs(ref - res);
				if (importanceMask)
				{
					difference *= importanceMask->getAccess().getPixDepth(x, y);
				}
				depthOk &= (difference < threshold);
			}
		}

		if (!depthOk)
			log << tcu::TestLog::Message << "Image comparison failed: difference = " << difference
				<< ", threshold = " << threshold << tcu::TestLog::EndMessage;
		tcu::Vec4 pixelBias(0.0f, 0.0f, 0.0f, 0.0f);
		tcu::Vec4 pixelScale(1.0f, 1.0f, 1.0f, 1.0f);
		log << tcu::TestLog::ImageSet("Result", "Depth image comparison result")
			<< tcu::TestLog::Image("Result", "Result", result.getAccess(), pixelScale, pixelBias)
			<< tcu::TestLog::Image("Reference", "Reference", reference.getAccess(), pixelScale, pixelBias);
		if (importanceMask)
		{
			log << tcu::TestLog::Image("Importance mask", "mask", importanceMask->getAccess(), pixelScale, pixelBias);
		}
		log << tcu::TestLog::EndImageSet;

		return depthOk;
	}